

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void storeRange(uint32_t start,uint32_t end,UStringPrepType type,UErrorCode *status)

{
  uint uVar1;
  int __status;
  UBool UVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_t sStack_20;
  
  uVar1 = type + 0xfff0;
  if ((int)uVar1 < 0x10000) {
    if (start != end) {
      UVar2 = utrie_setRange32_63(sprepTrie,start,end + 1,uVar1 & 0xffff,'\0');
      if (UVar2 != '\0') {
        return;
      }
      pcVar4 = "Value for certain codepoint already set.\n";
      sStack_20 = 0x29;
      goto LAB_0010a08c;
    }
    uVar3 = utrie_get32_63(sprepTrie,start,(UBool *)0x0);
    if (uVar3 == 0) {
LAB_0010a062:
      UVar2 = utrie_set32_63(sprepTrie,start,uVar1 & 0xffff);
      if (UVar2 != '\0') {
        return;
      }
      pcVar4 = "Could not set the value for code point \\U%08X.\n";
LAB_0010a0dc:
      fprintf(_stderr,pcVar4,start);
LAB_0010a0e5:
      __status = 1;
      goto LAB_0010a0e7;
    }
    if (type != USPREP_PROHIBITED || 0xffef < uVar3) {
      if (uVar3 == (uVar1 & 0xffff)) goto LAB_0010a062;
      pcVar4 = "Value for codepoint \\U%08X already set!.\n";
      goto LAB_0010a0dc;
    }
    if (uVar3 < 0xffef) {
      UVar2 = utrie_set32_63(sprepTrie,start,uVar3 + 1);
      if (UVar2 != '\0') {
        return;
      }
      fwrite("Could not set the value for code point.\n",0x28,1,_stderr);
      goto LAB_0010a0e5;
    }
    fprintf(_stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",0xfff0);
  }
  else {
    pcVar4 = "trieWord cannot contain value greater than 0xFFFF.\n";
    sStack_20 = 0x33;
LAB_0010a08c:
    fwrite(pcVar4,sStack_20,1,_stderr);
  }
  __status = 0xc;
LAB_0010a0e7:
  exit(__status);
}

Assistant:

extern void
storeRange(uint32_t start, uint32_t end, UStringPrepType type,UErrorCode* status){
    uint16_t trieWord = 0;

    if((int)(_SPREP_TYPE_THRESHOLD + type) > 0xFFFF){
        fprintf(stderr,"trieWord cannot contain value greater than 0xFFFF.\n");
        exit(U_ILLEGAL_CHAR_FOUND);
    }
    trieWord = (_SPREP_TYPE_THRESHOLD + type); /* the top 4 bits contain the value */
    if(start == end){
        uint32_t savedTrieWord = utrie_get32(sprepTrie, start, NULL);
        if(savedTrieWord>0){
            if(savedTrieWord < _SPREP_TYPE_THRESHOLD && type == USPREP_PROHIBITED){
                /* 
                 * A mapping is stored in the trie word 
                 * and the only other possible type that a 
                 * code point can have is USPREP_PROHIBITED
                 *
                 */

                /* turn on the 0th bit in the savedTrieWord */
                savedTrieWord += 0x01;

                /* the downcast is safe since we only save 16 bit values */
                trieWord = (uint16_t)savedTrieWord;

                /* make sure that the value of trieWord is less than the threshold */
                if(trieWord < _SPREP_TYPE_THRESHOLD){   
                    /* now set the value in the trie */
                    if(!utrie_set32(sprepTrie,start,trieWord)){
                        fprintf(stderr,"Could not set the value for code point.\n");
                        exit(U_ILLEGAL_ARGUMENT_ERROR);   
                    }
                    /* value is set so just return */
                    return;
                }else{
                    fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
                    exit(U_ILLEGAL_CHAR_FOUND);
                }
 
            }else if(savedTrieWord != trieWord){
                fprintf(stderr,"Value for codepoint \\U%08X already set!.\n", (int)start);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }
            /* if savedTrieWord == trieWord .. fall through and set the value */
        }
        if(!utrie_set32(sprepTrie,start,trieWord)){
            fprintf(stderr,"Could not set the value for code point \\U%08X.\n", (int)start);
            exit(U_ILLEGAL_ARGUMENT_ERROR);   
        }
    }else{
        if(!utrie_setRange32(sprepTrie, start, end+1, trieWord, FALSE)){
            fprintf(stderr,"Value for certain codepoint already set.\n");
            exit(U_ILLEGAL_CHAR_FOUND);   
        }
    }

}